

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

word wwShLoCarry(word *a,size_t n,size_t shift,word carry)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  
  uVar2 = n * 0x40 + 0x40;
  uVar6 = shift - uVar2;
  if (shift < uVar2) {
    uVar2 = shift >> 6;
    bVar1 = (byte)shift;
    bVar3 = bVar1 & 0x3f;
    if (shift < 0x40) {
      wVar5 = 0;
    }
    else {
      wVar5 = a[uVar2 - 1] >> bVar3;
    }
    if ((shift & 0x3f) == 0) {
      if (uVar2 < n) {
        uVar6 = 0;
        do {
          a[uVar6] = a[uVar2 + uVar6];
          uVar6 = uVar6 + 1;
        } while (n - uVar2 != uVar6);
      }
      else {
        uVar6 = 0;
      }
    }
    else {
      wVar4 = carry;
      if (uVar2 < n) {
        wVar4 = a[uVar2];
      }
      if (uVar2 + 1 < n) {
        uVar6 = 0;
        do {
          a[uVar6] = a[uVar2 + uVar6] >> (bVar1 & 0x3f) |
                     a[uVar2 + uVar6 + 1] << 0x40 - (bVar1 & 0x3f);
          uVar6 = uVar6 + 1;
        } while (~uVar2 + n != uVar6);
        uVar2 = uVar2 + uVar6;
      }
      else {
        uVar6 = 0;
      }
      wVar5 = wVar5 | wVar4 << (-bVar3 & 0x3f);
      if (uVar2 < n) {
        a[uVar6] = a[uVar2] >> (bVar1 & 0x3f) | carry << 0x40 - (bVar1 & 0x3f);
        uVar6 = uVar6 + 1;
      }
    }
    if (uVar6 < n) {
      a[uVar6] = carry >> bVar3;
      uVar6 = uVar6 + 1;
    }
    if (uVar6 <= n && n - uVar6 != 0) {
      memset(a + uVar6,0,(n - uVar6) * 8);
    }
  }
  else {
    if (n != 0) {
      memset(a,0,n << 3);
    }
    wVar5 = 0;
    if (uVar6 < 0x40) {
      wVar5 = carry >> ((byte)uVar6 & 0x3f);
    }
  }
  return wVar5;
}

Assistant:

word wwShLoCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W, pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[wshift - 1] >> shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[wshift] << (B_PER_W - shift);
			else
				ret |= carry << (B_PER_W - shift);
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// предпоследнее слово
			if (pos + wshift < n)
			{
				a[pos] = a[pos + wshift] >> shift | carry << (B_PER_W - shift);
				++pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = 0; pos + wshift < n; pos++)
				a[pos] = a[pos + wshift];
		}
		// последние слова
		if (pos < n)
			a[pos++] = carry >> shift;
		for (; pos < n; a[pos++] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry >> shift;
	}
	return ret;
}